

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

void __thiscall cmCursesMainForm::RePost(cmCursesMainForm *this)

{
  pointer *pppfVar1;
  FORM *form;
  pointer ppfVar2;
  __uniq_ptr_data<cmState,_std::default_delete<cmState>,_true,_true> _Var3;
  iterator iVar4;
  vector<fieldnode*,std::allocator<fieldnode*>> *this_00;
  bool bVar5;
  char *pcVar6;
  cmValue cVar7;
  FIELD **ppFVar8;
  fieldnode **ppfVar9;
  cmCursesCacheEntryComposite *entry;
  pointer pcVar10;
  cmCursesCacheEntryComposite *entry_1;
  allocator<char> local_81;
  string local_80;
  vector<fieldnode*,std::allocator<fieldnode*>> *local_60;
  string local_58;
  pointer local_38;
  
  form = (this->super_cmCursesForm).Form;
  if (form != (FORM *)0x0) {
    unpost_form(form);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  ppfVar2 = (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppfVar2) {
    (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppfVar2;
  }
  if (this->AdvancedMode == true) {
    this->NumberOfVisibleEntries =
         (long)(this->Entries).
               super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->Entries).
               super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
               ._M_impl.super__Vector_impl_data._M_start >> 6;
  }
  else {
    this->NumberOfVisibleEntries = 0;
    pcVar10 = (this->Entries).
              super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_38 = (this->Entries).
               super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar10 != local_38) {
      do {
        _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
        super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
             (((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
               _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
               super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
        pcVar6 = cmCursesCacheEntryComposite::GetValue(pcVar10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,pcVar6,(allocator<char> *)&local_58);
        cVar7 = cmState::GetCacheEntryValue
                          ((cmState *)
                           _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                           super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
        super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
             (((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
               _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
               super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
        pcVar6 = cmCursesCacheEntryComposite::GetValue(pcVar10);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar6,&local_81);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ADVANCED","");
        bVar5 = cmState::GetCacheEntryPropertyAsBool
                          ((cmState *)
                           _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                           super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_80,&local_58)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((cVar7.Value != (string *)0x0) && ((!bVar5 || (this->AdvancedMode != false)))) {
          this->NumberOfVisibleEntries = this->NumberOfVisibleEntries + 1;
        }
        pcVar10 = pcVar10 + 1;
      } while (pcVar10 != local_38);
    }
  }
  local_60 = (vector<fieldnode*,std::allocator<fieldnode*>> *)&this->Fields;
  if (this->NumberOfVisibleEntries == 0) {
    this->NumberOfVisibleEntries = 1;
  }
  std::vector<fieldnode_*,_std::allocator<fieldnode_*>_>::reserve
            ((vector<fieldnode_*,_std::allocator<fieldnode_*>_> *)local_60,
             this->NumberOfVisibleEntries * 3 + 1);
  pcVar10 = (this->Entries).
            super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->Entries).
             super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pcVar10 != local_38) {
    do {
      _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
      super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
           (((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
             _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
           super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
      pcVar6 = cmCursesCacheEntryComposite::GetValue(pcVar10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,pcVar6,(allocator<char> *)&local_58);
      cVar7 = cmState::GetCacheEntryValue
                        ((cmState *)
                         _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
      super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
           (((this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>.
             _M_t.super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
             super__Head_base<0UL,_cmake_*,_false>._M_head_impl)->State)._M_t.
           super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>;
      pcVar6 = cmCursesCacheEntryComposite::GetValue(pcVar10);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar6,&local_81);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ADVANCED","");
      bVar5 = cmState::GetCacheEntryPropertyAsBool
                        ((cmState *)
                         _Var3.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&local_80,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((cVar7.Value != (string *)0x0) && ((!bVar5 || (this->AdvancedMode != false)))) {
        ppFVar8 = (FIELD **)
                  ((long)&((pcVar10->Label)._M_t.
                           super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>
                           .super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl)->
                          super_cmCursesWidget + 0x30);
        iVar4._M_current =
             (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<fieldnode*,std::allocator<fieldnode*>>::_M_realloc_insert<fieldnode*const&>
                    (local_60,iVar4,ppFVar8);
        }
        else {
          *iVar4._M_current = *ppFVar8;
          pppfVar1 = &(this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppfVar1 = *pppfVar1 + 1;
        }
        ppFVar8 = &(((pcVar10->IsNewLabel)._M_t.
                     super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>
                     .super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl)->
                   super_cmCursesWidget).Field;
        iVar4._M_current =
             (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<fieldnode*,std::allocator<fieldnode*>>::_M_realloc_insert<fieldnode*const&>
                    (local_60,iVar4,ppFVar8);
        }
        else {
          *iVar4._M_current = *ppFVar8;
          pppfVar1 = &(this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppfVar1 = *pppfVar1 + 1;
        }
        ppFVar8 = &((pcVar10->Entry)._M_t.
                    super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>._M_t
                    .super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
                    super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl)->Field;
        iVar4._M_current =
             (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<fieldnode*,std::allocator<fieldnode*>>::_M_realloc_insert<fieldnode*const&>
                    (local_60,iVar4,ppFVar8);
        }
        else {
          *iVar4._M_current = *ppFVar8;
          pppfVar1 = &(this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppfVar1 = *pppfVar1 + 1;
        }
      }
      pcVar10 = pcVar10 + 1;
    } while (pcVar10 != local_38);
  }
  this_00 = local_60;
  iVar4._M_current =
       (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  bVar5 = (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
          super__Vector_impl_data._M_start == iVar4._M_current;
  this->IsEmpty = bVar5;
  if (bVar5) {
    ppfVar9 = (fieldnode **)
              ((long)(((this->EmptyCacheEntry)._M_t.
                       super___uniq_ptr_impl<cmCursesCacheEntryComposite,_std::default_delete<cmCursesCacheEntryComposite>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCursesCacheEntryComposite_*,_std::default_delete<cmCursesCacheEntryComposite>_>
                       .super__Head_base<0UL,_cmCursesCacheEntryComposite_*,_false>._M_head_impl)->
                     Label)._M_t + 0x30);
    if (iVar4._M_current ==
        (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<fieldnode*,std::allocator<fieldnode*>>::_M_realloc_insert<fieldnode*const&>
                (local_60,iVar4,ppfVar9);
    }
    else {
      *iVar4._M_current = *ppfVar9;
      pppfVar1 = &(this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppfVar1 = *pppfVar1 + 1;
    }
    iVar4._M_current =
         (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ppfVar9 = (fieldnode **)
              ((long)(((this->EmptyCacheEntry)._M_t.
                       super___uniq_ptr_impl<cmCursesCacheEntryComposite,_std::default_delete<cmCursesCacheEntryComposite>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCursesCacheEntryComposite_*,_std::default_delete<cmCursesCacheEntryComposite>_>
                       .super__Head_base<0UL,_cmCursesCacheEntryComposite_*,_false>._M_head_impl)->
                     IsNewLabel)._M_t.
                     super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>
              + 0x30);
    if (iVar4._M_current ==
        (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<fieldnode*,std::allocator<fieldnode*>>::_M_realloc_insert<fieldnode*const&>
                (this_00,iVar4,ppfVar9);
    }
    else {
      *iVar4._M_current = *ppfVar9;
      pppfVar1 = &(this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppfVar1 = *pppfVar1 + 1;
    }
    iVar4._M_current =
         (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ppfVar9 = (fieldnode **)
              ((long)(((this->EmptyCacheEntry)._M_t.
                       super___uniq_ptr_impl<cmCursesCacheEntryComposite,_std::default_delete<cmCursesCacheEntryComposite>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCursesCacheEntryComposite_*,_std::default_delete<cmCursesCacheEntryComposite>_>
                       .super__Head_base<0UL,_cmCursesCacheEntryComposite_*,_false>._M_head_impl)->
                     Entry)._M_t.
                     super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_> +
              0x30);
    if (iVar4._M_current ==
        (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<fieldnode*,std::allocator<fieldnode*>>::_M_realloc_insert<fieldnode*const&>
                (this_00,iVar4,ppfVar9);
    }
    else {
      *iVar4._M_current = *ppfVar9;
      pppfVar1 = &(this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppfVar1 = *pppfVar1 + 1;
    }
    this->NumberOfVisibleEntries = 1;
  }
  local_80._M_dataplus._M_p = (pointer)0x0;
  std::vector<fieldnode*,std::allocator<fieldnode*>>::emplace_back<fieldnode*>
            (this_00,(fieldnode **)&local_80);
  return;
}

Assistant:

void cmCursesMainForm::RePost()
{
  // Create the fields to be passed to the form.
  if (this->Form) {
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = nullptr;
  }
  this->Fields.clear();
  if (this->AdvancedMode) {
    this->NumberOfVisibleEntries = this->Entries.size();
  } else {
    // If normal mode, count only non-advanced entries
    this->NumberOfVisibleEntries = 0;
    for (cmCursesCacheEntryComposite& entry : this->Entries) {
      cmValue existingValue =
        this->CMakeInstance->GetState()->GetCacheEntryValue(entry.GetValue());
      bool advanced =
        this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
          entry.GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced)) {
        continue;
      }
      this->NumberOfVisibleEntries++;
    }
  }
  // there is always one even if it is the dummy one
  if (this->NumberOfVisibleEntries == 0) {
    this->NumberOfVisibleEntries = 1;
  }
  // Assign the fields: 3 for each entry: label, new entry marker
  // ('*' or ' ') and entry widget
  this->Fields.reserve(3 * this->NumberOfVisibleEntries + 1);

  // Assign fields
  for (cmCursesCacheEntryComposite& entry : this->Entries) {
    cmValue existingValue =
      this->CMakeInstance->GetState()->GetCacheEntryValue(entry.GetValue());
    bool advanced =
      this->CMakeInstance->GetState()->GetCacheEntryPropertyAsBool(
        entry.GetValue(), "ADVANCED");
    if (!existingValue || (!this->AdvancedMode && advanced)) {
      continue;
    }
    this->Fields.push_back(entry.Label->Field);
    this->Fields.push_back(entry.IsNewLabel->Field);
    this->Fields.push_back(entry.Entry->Field);
  }
  // if no cache entries there should still be one dummy field
  this->IsEmpty = this->Fields.empty();
  if (this->IsEmpty) {
    this->Fields.push_back(this->EmptyCacheEntry->Label->Field);
    this->Fields.push_back(this->EmptyCacheEntry->IsNewLabel->Field);
    this->Fields.push_back(this->EmptyCacheEntry->Entry->Field);
    this->NumberOfVisibleEntries = 1;
  }
  // Has to be null terminated.
  this->Fields.push_back(nullptr);
}